

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::SharedMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  bool bVar1;
  element_type *peVar2;
  Impl *local_40;
  Impl *local_28;
  shared_ptr<const_ON_Mesh> *pMesh;
  lock_guard<std::recursive_mutex> lock;
  mesh_type mesh_type_local;
  ON_BrepFace *this_local;
  
  lock._M_device._4_4_ = mesh_type;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&pMesh,&this->m_pImpl->m_mesh_mutex);
  if (lock._M_device._4_4_ == render_mesh) {
    local_28 = this->m_pImpl;
  }
  else if (lock._M_device._4_4_ == analysis_mesh) {
    local_28 = (Impl *)&this->m_pImpl->m_analysis_mesh;
  }
  else if (lock._M_device._4_4_ == preview_mesh) {
    local_28 = (Impl *)&this->m_pImpl->m_preview_mesh;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this->m_pImpl);
    if (bVar1) {
      local_40 = this->m_pImpl;
    }
    else {
      local_40 = (Impl *)&this->m_pImpl->m_analysis_mesh;
    }
    local_28 = local_40;
    peVar2 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    if (peVar2 == (element_type *)0x0) {
      local_28 = (Impl *)&this->m_pImpl->m_preview_mesh;
    }
  }
  if ((local_28 != (Impl *)0x0) &&
     (peVar2 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_28),
     peVar2 != (element_type *)0x0)) {
    peVar2 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_28);
    peVar2->m_parent = (ON_Object *)this;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&pMesh);
  return &local_28->m_render_mesh;
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::SharedMesh(ON::mesh_type mesh_type) const
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  std::shared_ptr<const ON_Mesh>* pMesh = nullptr;

  switch (mesh_type)
  {
  case ON::render_mesh:
    pMesh = &m_pImpl->m_render_mesh;
    break;
  case ON::analysis_mesh:
    pMesh = &m_pImpl->m_analysis_mesh;
    break;
  case ON::preview_mesh:
    pMesh = &m_pImpl->m_preview_mesh;
    break;
  default:
    pMesh = m_pImpl->m_render_mesh ? &m_pImpl->m_render_mesh : &m_pImpl->m_analysis_mesh;
    if (pMesh->get() == nullptr)
    {
      pMesh = &m_pImpl->m_preview_mesh;
    }
    break;
  }

  if (pMesh && pMesh->get())
  {
    const_cast<ON_Mesh*>(pMesh->get())->m_parent = this;
  }

  return *pMesh;
}